

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O3

uint arg_parse_uint_helper(arg *arg,char *err_msg)

{
  ulong uVar1;
  char *endptr;
  char *local_20;
  
  uVar1 = strtoul(arg->val,&local_20,10);
  if (err_msg != (char *)0x0) {
    *err_msg = '\0';
  }
  if ((*arg->val == '\0') || (*local_20 != '\0')) {
    if (err_msg != (char *)0x0) {
      uVar1 = 0;
      snprintf(err_msg,200,"Option %s: Invalid character \'%c\'\n",arg->name,
               (ulong)(uint)(int)*local_20);
      goto LAB_0012647e;
    }
  }
  else {
    if (uVar1 >> 0x20 == 0) goto LAB_0012647e;
    if (err_msg != (char *)0x0) {
      snprintf(err_msg,200,"Option %s: Value %lu out of range for unsigned int\n",arg->name,uVar1);
    }
  }
  uVar1 = 0;
LAB_0012647e:
  return (uint)uVar1;
}

Assistant:

unsigned int arg_parse_uint_helper(const struct arg *arg, char *err_msg) {
  char *endptr;
  const unsigned long rawval = strtoul(arg->val, &endptr, 10);  // NOLINT

  if (err_msg) err_msg[0] = '\0';

  if (arg->val[0] != '\0' && endptr[0] == '\0') {
    if (rawval <= UINT_MAX) return (unsigned int)rawval;
    SET_ERR_STRING("Option %s: Value %lu out of range for unsigned int\n",
                   arg->name, rawval);
    return 0;
  }
  SET_ERR_STRING("Option %s: Invalid character '%c'\n", arg->name, *endptr);
  return 0;
}